

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O0

HouseholderSequenceType * __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::householderQ
          (HouseholderSequenceType *__return_storage_ptr__,
          ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *this)

{
  ConjugateReturnType h;
  ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *this_local;
  
  if ((this->m_isInitialized & 1U) == 0) {
    __assert_fail("m_isInitialized && \"ColPivHouseholderQR is not initialized.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/QR/ColPivHouseholderQR.h"
                  ,0x291,
                  "typename ColPivHouseholderQR<MatrixType>::HouseholderSequenceType Eigen::ColPivHouseholderQR<Eigen::Matrix<float, -1, 8>>::householderQ() const [MatrixType = Eigen::Matrix<float, -1, 8>]"
                 );
  }
  h = DenseBase<Eigen::Matrix<float,_-1,_1,_0,_8,_1>_>::conjugate
                ((DenseBase<Eigen::Matrix<float,__1,_1,_0,_8,_1>_> *)&this->m_hCoeffs);
  HouseholderSequence<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_Eigen::Matrix<float,_-1,_1,_0,_8,_1>,_1>
  ::HouseholderSequence(__return_storage_ptr__,&this->m_qr,h);
  return __return_storage_ptr__;
}

Assistant:

typename ColPivHouseholderQR<MatrixType>::HouseholderSequenceType ColPivHouseholderQR<MatrixType>
  ::householderQ() const
{
  eigen_assert(m_isInitialized && "ColPivHouseholderQR is not initialized.");
  return HouseholderSequenceType(m_qr, m_hCoeffs.conjugate());
}